

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SetOwned_Test::
~MicroStringPrevTest_SetOwned_Test(MicroStringPrevTest_SetOwned_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_SetOwned_Test::~MicroStringPrevTest_SetOwned_Test
            ((MicroStringPrevTest_SetOwned_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetOwned) {
  for (size_t size : {str_.kMaxMicroRepCapacity + 1, size_t{300}}) {
    const std::string input(size, 'x');
    const size_t used = arena_space_used();
    const size_t self_used = str_.SpaceUsedExcludingSelfLong();
    const bool will_reuse = str_.Capacity() >= input.size();
    str_.Set(input, arena());
    EXPECT_EQ(str_.Get(), input);

    if (will_reuse) {
      ExpectMemoryUsed(used, false, self_used);
    } else {
      ExpectMemoryUsed(used, true, kLargeRepSize + size);
    }
  }
}